

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O1

DIEsForAddress * __thiscall
llvm::DWARFContext::getDIEsForAddress
          (DIEsForAddress *__return_storage_ptr__,DWARFContext *this,uint64_t Address)

{
  bool bVar1;
  DWARFUnit *this_00;
  DWARFDie DVar2;
  undefined1 local_88 [8];
  DWARFDie Child;
  undefined1 auStack_68 [8];
  DWARFDie DIE;
  iterator __begin2;
  vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> Worklist;
  
  (__return_storage_ptr__->FunctionDIE).Die = (DWARFDebugInfoEntry *)0x0;
  (__return_storage_ptr__->BlockDIE).U = (DWARFUnit *)0x0;
  __return_storage_ptr__->CompileUnit = (DWARFCompileUnit *)0x0;
  (__return_storage_ptr__->FunctionDIE).U = (DWARFUnit *)0x0;
  (__return_storage_ptr__->BlockDIE).Die = (DWARFDebugInfoEntry *)0x0;
  this_00 = &getCompileUnitForAddress(this,Address)->super_DWARFUnit;
  if (this_00 != (DWARFUnit *)0x0) {
    __return_storage_ptr__->CompileUnit = (DWARFCompileUnit *)this_00;
    DVar2 = DWARFUnit::getSubroutineForAddress(this_00,Address);
    __return_storage_ptr__->FunctionDIE = DVar2;
    __begin2.Die.Die = (DWARFDebugInfoEntry *)0x0;
    std::vector<llvm::DWARFDie,std::allocator<llvm::DWARFDie>>::
    _M_realloc_insert<llvm::DWARFDie_const&>
              ((vector<llvm::DWARFDie,std::allocator<llvm::DWARFDie>> *)&__begin2.Die.Die,
               (iterator)0x0,&__return_storage_ptr__->FunctionDIE);
    Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (__begin2.Die.Die != (DWARFDebugInfoEntry *)0x0) {
      do {
        auStack_68 = (undefined1  [8])
                     Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>.
                     _M_impl.super__Vector_impl_data._M_start[-1].U;
        DIE.U = (DWARFUnit *)
                Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl
                .super__Vector_impl_data._M_start[-1].Die;
        Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
        super__Vector_impl_data._M_start =
             Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
             super__Vector_impl_data._M_start + -1;
        if (auStack_68 != (undefined1  [8])0x0 && DIE.U != (DWARFUnit *)0x0) {
          if ((((DIE.U)->InfoSection != (DWARFSection *)0x0) &&
              (*(short *)((long)&((DIE.U)->InfoSection->Data).Data + 4) == 0xb)) &&
             (bVar1 = DWARFDie::addressRangeContainsAddress((DWARFDie *)auStack_68,Address), bVar1))
          {
            (__return_storage_ptr__->BlockDIE).U = (DWARFUnit *)auStack_68;
            (__return_storage_ptr__->BlockDIE).Die = (DWARFDebugInfoEntry *)DIE.U;
            break;
          }
          join_0x00000010_0x00000000_ = DWARFDie::getFirstChild((DWARFDie *)auStack_68);
          DVar2 = DWARFDie::getLastChild((DWARFDie *)auStack_68);
          if ((__begin2.Die.U != (DWARFUnit *)DVar2.Die) || ((DWARFUnit *)DIE.Die != DVar2.U)) {
            do {
              local_88 = (undefined1  [8])DIE.Die;
              Child.U = __begin2.Die.U;
              if (Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>.
                  _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
                std::vector<llvm::DWARFDie,std::allocator<llvm::DWARFDie>>::
                _M_realloc_insert<llvm::DWARFDie_const&>
                          ((vector<llvm::DWARFDie,std::allocator<llvm::DWARFDie>> *)
                           &__begin2.Die.Die,(iterator)0x0,(DWARFDie *)local_88);
              }
              else {
                (Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>.
                 _M_impl.super__Vector_impl_data._M_start)->U = (DWARFUnit *)DIE.Die;
                (Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>.
                 _M_impl.super__Vector_impl_data._M_start)->Die =
                     (DWARFDebugInfoEntry *)__begin2.Die.U;
                Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl
                .super__Vector_impl_data._M_start =
                     Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1;
              }
              join_0x00000010_0x00000000_ = DWARFDie::getSibling((DWARFDie *)&DIE.Die);
            } while (SUB168((undefined1  [16])DVar2 ^ (undefined1  [16])join_0x00000010_0x00000000_,
                            0) != 0 ||
                     SUB168((undefined1  [16])DVar2 ^ (undefined1  [16])join_0x00000010_0x00000000_,
                            8) != 0);
          }
        }
      } while (__begin2.Die.Die !=
               (DWARFDebugInfoEntry *)
               Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
               super__Vector_impl_data._M_start);
    }
    if (__begin2.Die.Die != (DWARFDebugInfoEntry *)0x0) {
      operator_delete(__begin2.Die.Die,-(long)__begin2.Die.Die);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DWARFContext::DIEsForAddress DWARFContext::getDIEsForAddress(uint64_t Address) {
  DIEsForAddress Result;

  DWARFCompileUnit *CU = getCompileUnitForAddress(Address);
  if (!CU)
    return Result;

  Result.CompileUnit = CU;
  Result.FunctionDIE = CU->getSubroutineForAddress(Address);

  std::vector<DWARFDie> Worklist;
  Worklist.push_back(Result.FunctionDIE);
  while (!Worklist.empty()) {
    DWARFDie DIE = Worklist.back();
    Worklist.pop_back();

    if (!DIE.isValid())
      continue;

    if (DIE.getTag() == DW_TAG_lexical_block &&
        DIE.addressRangeContainsAddress(Address)) {
      Result.BlockDIE = DIE;
      break;
    }

    for (auto Child : DIE)
      Worklist.push_back(Child);
  }

  return Result;
}